

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoNight_x86.h
# Opt level: O3

void xmrig::cryptonight_double_hash<true>
               (uint8_t *input,size_t size,uint8_t *output,cryptonight_ctx **ctx,uint64_t height,
               uint64_t extra_iters)

{
  long *plVar1;
  long *plVar2;
  ulong *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  cryptonight_ctx *input_00;
  cryptonight_ctx *input_01;
  __m128i *output_00;
  __m128i *output_01;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  undefined1 auVar43 [16];
  uint uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  uint8_t *hashval;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  ulong uVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  
  input_00 = *ctx;
  keccak(input,(int)size,input_00->state,200);
  input_01 = ctx[1];
  keccak(input + size,(int)size,input_01->state,200);
  output_00 = (__m128i *)input_00->memory;
  output_01 = (__m128i *)input_01->memory;
  uVar54 = *(ulong *)((long)input_00->state + 0x60);
  lVar48 = *(long *)((long)input_00->state + 0x68);
  uVar83 = *(ulong *)((long)input_01->state + 0x60);
  uVar77 = *(ulong *)((long)input_01->state + 0x68);
  fesetround(0x400);
  cn_explode_scratchpad<true>((__m128i *)input_00,output_00);
  cn_explode_scratchpad<true>((__m128i *)input_01,output_01);
  auVar43 = _DAT_0018bc00;
  uVar49 = extra_iters + 0x40000 >> 1 & 0xffffffff;
  if (uVar49 != 0) {
    uVar71 = *(ulong *)((long)input_01->state + 0x20) ^ *(ulong *)input_01->state;
    uVar58 = *(ulong *)((long)input_01->state + 0x28) ^ *(longlong *)((long)input_01->state + 8);
    uVar59 = *(ulong *)((long)input_00->state + 0x20) ^ *(ulong *)input_00->state;
    uVar60 = *(ulong *)((long)input_00->state + 0x28) ^ *(longlong *)((long)input_00->state + 8);
    uVar66 = *(ulong *)((long)input_01->state + 0x30) ^ *(ulong *)((long)input_01->state + 0x10);
    uVar68 = *(ulong *)((long)input_01->state + 0x38) ^ *(ulong *)((long)input_01->state + 0x18);
    uVar75 = *(ulong *)((long)input_01->state + 0x40) ^ *(ulong *)((long)input_01->state + 0x50);
    uVar76 = *(ulong *)((long)input_01->state + 0x48) ^ *(ulong *)((long)input_01->state + 0x58);
    uVar62 = *(ulong *)((long)input_00->state + 0x30) ^ *(ulong *)((long)input_00->state + 0x10);
    uVar64 = *(ulong *)((long)input_00->state + 0x38) ^ *(ulong *)((long)input_00->state + 0x18);
    uVar81 = *(ulong *)((long)input_00->state + 0x40) ^ *(ulong *)((long)input_00->state + 0x50);
    uVar82 = *(ulong *)((long)input_00->state + 0x48) ^ *(ulong *)((long)input_00->state + 0x58);
    do {
      uVar63 = uVar64;
      uVar61 = uVar62;
      uVar67 = uVar68;
      uVar65 = uVar66;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = uVar77;
      uVar50 = uVar59 & 0xffff0;
      uVar44 = *(uint *)((long)*output_00 + uVar50);
      uVar4 = *(uint *)((long)*output_00 + uVar50 + 4);
      uVar5 = *(uint *)((long)*output_00 + uVar50 + 8);
      uVar6 = *(uint *)((long)*output_00 + uVar50 + 0xc);
      uVar7 = saes_table[1][uVar4 >> 8 & 0xff];
      uVar8 = saes_table[0][uVar44 & 0xff];
      uVar9 = saes_table[1][uVar5 >> 8 & 0xff];
      uVar10 = saes_table[0][uVar4 & 0xff];
      uVar11 = saes_table[1][uVar6 >> 8 & 0xff];
      uVar12 = saes_table[0][uVar5 & 0xff];
      uVar13 = saes_table[1][uVar44 >> 8 & 0xff];
      uVar14 = saes_table[0][uVar6 & 0xff];
      uVar15 = *(uint *)((long)saes_table[2] + (ulong)(uVar5 >> 0xe & 0x3fc));
      uVar16 = *(uint *)((long)saes_table[2] + (ulong)(uVar6 >> 0xe & 0x3fc));
      uVar17 = *(uint *)((long)saes_table[2] + (ulong)(uVar44 >> 0xe & 0x3fc));
      uVar18 = *(uint *)((long)saes_table[2] + (ulong)(uVar4 >> 0xe & 0x3fc));
      uVar6 = *(uint *)((long)saes_table[3] + (ulong)(uVar6 >> 0x16 & 0xfffffffc));
      uVar44 = *(uint *)((long)saes_table[3] + (ulong)(uVar44 >> 0x16 & 0xfffffffc));
      uVar57 = uVar71 & 0xffff0;
      uVar4 = *(uint *)((long)saes_table[3] + (ulong)(uVar4 >> 0x16 & 0xfffffffc));
      uVar19 = *(uint *)((long)*output_01 + uVar57);
      uVar20 = *(uint *)((long)*output_01 + uVar57 + 4);
      uVar5 = *(uint *)((long)saes_table[3] + (ulong)(uVar5 >> 0x16 & 0xfffffffc));
      uVar21 = *(uint *)((long)*output_01 + uVar57 + 8);
      uVar22 = *(uint *)((long)*output_01 + uVar57 + 0xc);
      uVar23 = saes_table[1][uVar20 >> 8 & 0xff];
      uVar24 = saes_table[0][uVar19 & 0xff];
      uVar25 = saes_table[1][uVar21 >> 8 & 0xff];
      uVar26 = saes_table[0][uVar20 & 0xff];
      uVar27 = saes_table[1][uVar22 >> 8 & 0xff];
      uVar28 = saes_table[0][uVar21 & 0xff];
      uVar29 = saes_table[1][uVar19 >> 8 & 0xff];
      uVar30 = saes_table[0][uVar22 & 0xff];
      uVar31 = *(uint *)((long)saes_table[2] + (ulong)(uVar21 >> 0xe & 0x3fc));
      uVar32 = *(uint *)((long)saes_table[2] + (ulong)(uVar22 >> 0xe & 0x3fc));
      uVar33 = *(uint *)((long)saes_table[2] + (ulong)(uVar19 >> 0xe & 0x3fc));
      uVar34 = *(uint *)((long)saes_table[2] + (ulong)(uVar20 >> 0xe & 0x3fc));
      uVar22 = *(uint *)((long)saes_table[3] + (ulong)(uVar22 >> 0x16 & 0xfffffffc));
      uVar19 = *(uint *)((long)saes_table[3] + (ulong)(uVar19 >> 0x16 & 0xfffffffc));
      uVar20 = *(uint *)((long)saes_table[3] + (ulong)(uVar20 >> 0x16 & 0xfffffffc));
      uVar21 = *(uint *)((long)saes_table[3] + (ulong)(uVar21 >> 0x16 & 0xfffffffc));
      plVar1 = (long *)((long)*output_00 + (uVar50 ^ 0x30));
      lVar38 = plVar1[1];
      plVar2 = (long *)((long)*output_00 + (uVar50 ^ 0x10));
      lVar39 = *plVar2;
      lVar40 = plVar2[1];
      plVar2 = (long *)((long)*output_00 + (uVar50 ^ 0x20));
      lVar41 = *plVar2;
      lVar42 = plVar2[1];
      plVar2 = (long *)((long)*output_00 + (uVar50 ^ 0x10));
      *plVar2 = *plVar1 + uVar81;
      plVar2[1] = lVar38 + uVar82;
      uVar62 = CONCAT44(uVar9 ^ uVar10 ^ uVar16 ^ uVar44,uVar7 ^ uVar8 ^ uVar15 ^ uVar6) ^ uVar59;
      uVar64 = CONCAT44(uVar13 ^ uVar14 ^ uVar18 ^ uVar5,uVar11 ^ uVar12 ^ uVar17 ^ uVar4) ^ uVar60;
      plVar1 = (long *)((long)*output_00 + (uVar50 ^ 0x20));
      *plVar1 = lVar39 + uVar61;
      plVar1[1] = lVar40 + uVar63;
      plVar1 = (long *)((long)*output_00 + (uVar50 ^ 0x30));
      *plVar1 = lVar41 + uVar59;
      plVar1[1] = lVar42 + uVar60;
      uVar66 = CONCAT44(uVar25 ^ uVar26 ^ uVar32 ^ uVar19,uVar23 ^ uVar24 ^ uVar31 ^ uVar22) ^
               uVar71;
      uVar68 = CONCAT44(uVar29 ^ uVar30 ^ uVar34 ^ uVar21,uVar27 ^ uVar28 ^ uVar33 ^ uVar20) ^
               uVar58;
      puVar3 = (ulong *)((long)*output_00 + uVar50);
      *puVar3 = uVar62 ^ uVar61;
      puVar3[1] = uVar64 ^ uVar63;
      plVar1 = (long *)((long)*output_01 + (uVar57 ^ 0x30));
      lVar38 = plVar1[1];
      plVar2 = (long *)((long)*output_01 + (uVar57 ^ 0x10));
      lVar39 = *plVar2;
      lVar40 = plVar2[1];
      plVar2 = (long *)((long)*output_01 + (uVar57 ^ 0x20));
      lVar41 = *plVar2;
      lVar42 = plVar2[1];
      plVar2 = (long *)((long)*output_01 + (uVar57 ^ 0x10));
      *plVar2 = *plVar1 + uVar75;
      plVar2[1] = lVar38 + uVar76;
      uVar56 = uVar62 & 0xffff0;
      plVar1 = (long *)((long)*output_01 + (uVar57 ^ 0x20));
      *plVar1 = lVar39 + uVar65;
      plVar1[1] = lVar40 + uVar67;
      plVar1 = (long *)((long)*output_01 + (uVar57 ^ 0x30));
      *plVar1 = lVar41 + uVar71;
      plVar1[1] = lVar42 + uVar58;
      puVar3 = (ulong *)((long)*output_01 + uVar57);
      *puVar3 = uVar66 ^ uVar65;
      puVar3[1] = uVar68 ^ uVar67;
      uVar55 = (ulong)((int)uVar62 + (int)lVar48 * 2 & 0x7ffffffe) | 0x80000001;
      uVar51 = lVar48 << 0x20 ^ uVar54 ^ *(ulong *)((long)*output_00 + uVar56);
      auVar79._8_8_ = 0;
      auVar79._0_8_ = uVar51;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar62;
      uVar52 = SUB168(auVar79 * auVar36,8);
      uVar45 = SUB168(auVar79 * auVar36,0);
      uVar53 = uVar56 ^ 0x20;
      uVar54 = *(ulong *)((long)*output_00 + uVar53);
      uVar57 = *(ulong *)((long)*output_00 + uVar53 + 8);
      puVar3 = (ulong *)((long)*output_00 + (uVar56 ^ 0x10));
      uVar46 = *puVar3;
      uVar47 = puVar3[1];
      plVar1 = (long *)((long)*output_00 + (uVar56 ^ 0x30));
      lVar48 = plVar1[1];
      plVar2 = (long *)((long)*output_00 + uVar53);
      lVar38 = *plVar2;
      lVar39 = plVar2[1];
      uVar50 = *(ulong *)((long)*output_00 + uVar56 + 8);
      plVar2 = (long *)((long)*output_00 + (uVar56 ^ 0x10));
      *plVar2 = uVar81 + *plVar1;
      plVar2[1] = uVar82 + lVar48;
      uVar81 = (uVar52 ^ uVar54) + uVar59;
      uVar82 = (uVar45 ^ uVar57) + uVar60;
      plVar1 = (long *)((long)*output_00 + uVar53);
      *plVar1 = (uVar52 ^ uVar46) + uVar61;
      plVar1[1] = (uVar45 ^ uVar47) + uVar63;
      plVar1 = (long *)((long)*output_00 + (uVar56 ^ 0x30));
      *plVar1 = lVar38 + uVar59;
      plVar1[1] = lVar39 + uVar60;
      uVar53 = uVar66 & 0xffff0;
      puVar3 = (ulong *)((long)*output_00 + uVar56);
      *puVar3 = uVar81;
      puVar3[1] = uVar82;
      uVar45 = uVar77 << 0x20 ^ uVar83 ^ *(ulong *)((long)*output_01 + uVar53);
      uVar54 = (ulong)((int)uVar66 + (int)uVar77 * 2 & 0x7ffffffe) | 0x80000001;
      uVar83 = uVar68 / uVar54 & 0xffffffff | uVar68 % uVar54 << 0x20;
      uVar54 = uVar64 / uVar55 & 0xffffffff | uVar64 % uVar55 << 0x20;
      auVar69._0_8_ = uVar66 + uVar83;
      auVar69._8_8_ = uVar62 + uVar54;
      auVar74._0_8_ = auVar69._0_8_ >> 0xc;
      auVar74._8_8_ = auVar69._8_8_ >> 0xc;
      auVar79 = sqrtpd(auVar78,auVar74 | _DAT_0018f250);
      uVar59 = uVar51 ^ uVar81;
      uVar60 = uVar50 ^ uVar82;
      uVar81 = auVar79._0_8_ >> 0x14;
      uVar82 = auVar79._8_8_ >> 0x14;
      uVar77 = auVar79._0_8_ >> 0x13;
      uVar55 = auVar79._8_8_ >> 0x13;
      uVar50 = uVar81 - 0x3fe00000000;
      uVar57 = uVar82 - 0x3fe00000000;
      uVar81 = (uVar77 - uVar81) - 0x3fdffffffff;
      uVar82 = (uVar55 - uVar82) - 0x3fdffffffff;
      auVar72._0_8_ =
           (uVar81 & 0xffffffff) * (uVar50 & 0xffffffff) +
           ((uVar81 >> 0x20) * (uVar50 & 0xffffffff) + (uVar50 >> 0x20) * (uVar81 & 0xffffffff) <<
           0x20);
      auVar72._8_8_ =
           (uVar82 & 0xffffffff) * (uVar57 & 0xffffffff) +
           ((uVar82 >> 0x20) * (uVar57 & 0xffffffff) + (uVar57 >> 0x20) * (uVar82 & 0xffffffff) <<
           0x20);
      auVar69 = auVar69 ^ auVar43;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar45;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar66;
      uVar51 = SUB168(auVar35 * auVar37,8);
      uVar46 = SUB168(auVar35 * auVar37,0);
      auVar72 = auVar72 ^ auVar43;
      auVar80._0_4_ = -(uint)(auVar69._0_4_ == auVar72._0_4_);
      auVar80._4_4_ = -(uint)(auVar69._4_4_ == auVar72._4_4_);
      auVar80._8_4_ = -(uint)(auVar69._8_4_ == auVar72._8_4_);
      auVar80._12_4_ = -(uint)(auVar69._12_4_ == auVar72._12_4_);
      uVar52 = uVar53 ^ 0x20;
      uVar82 = *(ulong *)((long)*output_01 + uVar52);
      auVar70._0_4_ = -(uint)(auVar72._0_4_ < auVar69._0_4_);
      auVar70._4_4_ = -(uint)(auVar72._4_4_ < auVar69._4_4_);
      auVar70._8_4_ = -(uint)(auVar72._8_4_ < auVar69._8_4_);
      auVar70._12_4_ = -(uint)(auVar72._12_4_ < auVar69._12_4_);
      uVar47 = uVar46 ^ *(ulong *)((long)*output_01 + uVar52 + 8);
      auVar73._4_4_ = auVar70._0_4_;
      auVar73._0_4_ = auVar70._0_4_;
      auVar73._8_4_ = auVar70._8_4_;
      auVar73._12_4_ = auVar70._8_4_;
      plVar1 = (long *)((long)*output_01 + (uVar53 ^ 0x30));
      lVar48 = plVar1[1];
      plVar2 = (long *)((long)*output_01 + uVar52);
      lVar38 = *plVar2;
      lVar39 = plVar2[1];
      uVar81 = *(ulong *)((long)*output_01 + uVar53 + 8);
      puVar3 = (ulong *)((long)*output_01 + (uVar53 ^ 0x10));
      uVar50 = *puVar3;
      uVar57 = puVar3[1];
      plVar2 = (long *)((long)*output_01 + (uVar53 ^ 0x10));
      *plVar2 = uVar75 + *plVar1;
      plVar2[1] = uVar76 + lVar48;
      plVar1 = (long *)((long)*output_01 + uVar52);
      *plVar1 = (uVar51 ^ uVar50) + uVar65;
      plVar1[1] = (uVar46 ^ uVar57) + uVar67;
      plVar1 = (long *)((long)*output_01 + (uVar53 ^ 0x30));
      *plVar1 = lVar38 + uVar71;
      plVar1[1] = lVar39 + uVar58;
      uVar44 = movmskpd((int)uVar47,auVar73 & auVar80 | auVar70);
      uVar77 = uVar77 + (uVar44 & 1);
      lVar48 = (uVar55 & 0xffffffff) + (ulong)(byte)((byte)uVar44 >> 1);
      uVar71 = (uVar51 ^ uVar82) + uVar71;
      uVar47 = uVar47 + uVar58;
      puVar3 = (ulong *)((long)*output_01 + uVar53);
      *puVar3 = uVar71;
      puVar3[1] = uVar47;
      uVar71 = uVar45 ^ uVar71;
      uVar58 = uVar81 ^ uVar47;
      uVar49 = uVar49 - 1;
      uVar75 = uVar65;
      uVar76 = uVar67;
      uVar81 = uVar61;
      uVar82 = uVar63;
    } while (uVar49 != 0);
  }
  cn_implode_scratchpad<true>(output_00,(__m128i *)input_00);
  cn_implode_scratchpad<true>(output_01,(__m128i *)input_01);
  keccakf((uint64_t *)input_00,0x18);
  keccakf((uint64_t *)input_01,0x18);
  (*(code *)(&extra_hashes)[(byte)*(longlong *)input_00->state & 3])(input_00,200,output);
  hashval = output + 0x20;
  switch((byte)*(longlong *)input_01->state & 3) {
  case 0:
    blake256_hash(hashval,input_01->state,200);
    return;
  case 1:
    groestl(input_01->state,0x640,hashval);
    return;
  case 2:
    jh_hash(0x100,input_01->state,0x640,hashval);
    return;
  case 3:
    xmr_skein(input_01->state,hashval);
    return;
  }
}

Assistant:

inline void cryptonight_double_hash(const uint8_t *__restrict__ input, size_t size, uint8_t *__restrict__ output, cryptonight_ctx **__restrict__ ctx, uint64_t height, uint64_t extra_iters)
{
    constexpr CnAlgo props;
    constexpr size_t MASK        = props.mask();

    uint32_t iters = (props.iterations() + extra_iters) >> 1;

    keccak(input,        size, ctx[0]->state);
    keccak(input + size, size, ctx[1]->state);

    uint8_t *l0  = ctx[0]->memory;
    uint8_t *l1  = ctx[1]->memory;
    uint64_t *h0 = reinterpret_cast<uint64_t*>(ctx[0]->state);
    uint64_t *h1 = reinterpret_cast<uint64_t*>(ctx[1]->state);

    VARIANT2_INIT(0);
    VARIANT2_INIT(1);
    VARIANT2_SET_ROUNDING_MODE();

    cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(h0), reinterpret_cast<__m128i *>(l0));
    cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(h1), reinterpret_cast<__m128i *>(l1));

    uint64_t al0 = h0[0] ^ h0[4];
    uint64_t al1 = h1[0] ^ h1[4];
    uint64_t ah0 = h0[1] ^ h0[5];
    uint64_t ah1 = h1[1] ^ h1[5];

    __m128i bx00 = _mm_set_epi64x(h0[3] ^ h0[7], h0[2] ^ h0[6]);
    __m128i bx01 = _mm_set_epi64x(h0[9] ^ h0[11], h0[8] ^ h0[10]);
    __m128i bx10 = _mm_set_epi64x(h1[3] ^ h1[7], h1[2] ^ h1[6]);
    __m128i bx11 = _mm_set_epi64x(h1[9] ^ h1[11], h1[8] ^ h1[10]);

    uint64_t idx0 = al0;
    uint64_t idx1 = al1;

    for (size_t i = 0; i < iters; i++) {
        __m128i cx0, cx1;
        if (!SOFT_AES) {
            cx0 = _mm_load_si128(reinterpret_cast<const __m128i *>(&l0[idx0 & MASK]));
            cx1 = _mm_load_si128(reinterpret_cast<const __m128i *>(&l1[idx1 & MASK]));
        }

        const __m128i ax0 = _mm_set_epi64x(ah0, al0);
        const __m128i ax1 = _mm_set_epi64x(ah1, al1);
        if (SOFT_AES) {
            cx0 = soft_aesenc(&l0[idx0 & MASK], ax0, reinterpret_cast<const uint32_t*>(saes_table));
            cx1 = soft_aesenc(&l1[idx1 & MASK], ax1, reinterpret_cast<const uint32_t*>(saes_table));
        }
        else {
            cx0 = _mm_aesenc_si128(cx0, ax0);
            cx1 = _mm_aesenc_si128(cx1, ax1);
        }

        cryptonight_monero_tweak((uint64_t*)&l0[idx0 & MASK], l0, idx0 & MASK, ax0, bx00, bx01, cx0);
        cryptonight_monero_tweak((uint64_t*)&l1[idx1 & MASK], l1, idx1 & MASK, ax1, bx10, bx11, cx1);

        idx0 = _mm_cvtsi128_si64(cx0);
        idx1 = _mm_cvtsi128_si64(cx1);

        uint64_t hi, lo, cl, ch;
        cl = ((uint64_t*) &l0[idx0 & MASK])[0];
        ch = ((uint64_t*) &l0[idx0 & MASK])[1];

        VARIANT2_INTEGER_MATH(0, cl, cx0);

        lo = __umul128(idx0, cl, &hi);

        VARIANT2_SHUFFLE2(l0, idx0 & MASK, ax0, bx00, bx01, hi, lo, 0);

        al0 += hi;
        ah0 += lo;

        ((uint64_t*)&l0[idx0 & MASK])[0] = al0;
        ((uint64_t*) &l0[idx0 & MASK])[1] = ah0;

        al0 ^= cl;
        ah0 ^= ch;
        idx0 = al0;

        cl = ((uint64_t*) &l1[idx1 & MASK])[0];
        ch = ((uint64_t*) &l1[idx1 & MASK])[1];

        VARIANT2_INTEGER_MATH(1, cl, cx1);

        lo = __umul128(idx1, cl, &hi);

        VARIANT2_SHUFFLE2(l1, idx1 & MASK, ax1, bx10, bx11, hi, lo, 0);

        al1 += hi;
        ah1 += lo;

        ((uint64_t*)&l1[idx1 & MASK])[0] = al1;
        ((uint64_t*)&l1[idx1 & MASK])[1] = ah1;

        al1 ^= cl;
        ah1 ^= ch;
        idx1 = al1;

        bx01 = bx00;
        bx11 = bx10;

        bx00 = cx0;
        bx10 = cx1;
    }

    cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(l0), reinterpret_cast<__m128i *>(h0));
    cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(l1), reinterpret_cast<__m128i *>(h1));

    keccakf(h0, 24);
    keccakf(h1, 24);

    extra_hashes[ctx[0]->state[0] & 3](ctx[0]->state, 200, output);
    extra_hashes[ctx[1]->state[0] & 3](ctx[1]->state, 200, output + 32);
}